

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O3

void __thiscall
RecoveryTest_PureVirtualMethodCallTest_Test::TestBody
          (RecoveryTest_PureVirtualMethodCallTest_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  char *message;
  byte bVar4;
  DeathTest *pDVar6;
  DeathTest *gtest_dt;
  char regex [31];
  DeathTest *local_128;
  DeathTest *local_120;
  ExitedOrKilled local_118 [4];
  char local_f8 [40];
  RE local_d0;
  Base local_40;
  byte bVar5;
  
  builtin_strncpy(local_f8,"PosixCrashHandler::handleCrash",0x1f);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::RE::Init(&local_d0,local_f8);
    bVar2 = testing::internal::DeathTest::Create
                      ("Derived()",&local_d0,
                       "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
                       ,0x32,&local_128);
    pDVar6 = local_128;
    if (bVar2) {
      if (local_128 != (DeathTest *)0x0) {
        local_120 = local_128;
        iVar3 = (*local_128->_vptr_DeathTest[2])(local_128);
        pDVar1 = local_128;
        if (iVar3 == 0) {
          extensions::ExitedOrKilled::ExitedOrKilled(local_118,3,0xb);
          iVar3 = (*local_128->_vptr_DeathTest[3])();
          bVar2 = extensions::ExitedOrKilled::operator()(local_118,iVar3);
          iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
          bVar5 = (byte)iVar3;
          bVar4 = bVar5 ^ 1;
        }
        else {
          bVar5 = 1;
          if (iVar3 == 1) {
            bVar2 = testing::internal::AlwaysTrue();
            if (bVar2) {
              local_40.m_pDerived = (Derived *)&local_40;
              local_40._vptr_Base = (_func_int **)&PTR_function_00143be8;
              Base::~Base((Base *)local_40.m_pDerived);
            }
            (*local_128->_vptr_DeathTest[5])(local_128,2);
            (*pDVar1->_vptr_DeathTest[5])(pDVar1,0);
            pDVar6 = local_120;
            if (local_120 == (DeathTest *)0x0) goto LAB_0010c7fe;
          }
          bVar4 = 0;
        }
        bVar2 = testing::internal::IsTrue(true);
        if (bVar2) {
          (*pDVar6->_vptr_DeathTest[1])(pDVar6);
        }
        if (bVar5 == 0) {
          testing::internal::RE::~RE(&local_d0);
          if (bVar4 == 0) {
            return;
          }
          goto LAB_0010c72f;
        }
      }
LAB_0010c7fe:
      testing::internal::RE::~RE(&local_d0);
      return;
    }
    testing::internal::RE::~RE(&local_d0);
  }
LAB_0010c72f:
  testing::Message::Message((Message *)&local_d0);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_118,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
             ,0x32,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)&local_d0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
  if ((((long *)local_d0.pattern_ != (long *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)local_d0.pattern_ != (long *)0x0)) {
    (**(code **)(*(long *)local_d0.pattern_ + 8))();
  }
  return;
}

Assistant:

TEST_F (RecoveryTest, PureVirtualMethodCallTest) {
#ifdef _WIN32
    const char regex[] = "::PureCallHandler";
#else
    const char regex[] = "PosixCrashHandler::handleCrash";
#endif
    
    ASSERT_EXIT(Derived(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGSEGV), regex);
}